

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioVoice_SetEffectParameters
                   (FAudioVoice *voice,uint32_t EffectIndex,void *pParameters,
                   uint32_t ParametersByteSize,uint32_t OperationSet)

{
  void *pvVar1;
  uint32_t in_ECX;
  void *in_RDX;
  uint in_ESI;
  FAudioVoice *in_RDI;
  uint32_t in_R8D;
  
  if ((in_R8D == 0) || (in_RDI->audio->active == '\0')) {
    if ((in_RDI->effects).parameters[in_ESI] == (void *)0x0) {
      pvVar1 = (*in_RDI->audio->pMalloc)((size_t)in_ECX);
      (in_RDI->effects).parameters[in_ESI] = pvVar1;
      (in_RDI->effects).parameterSizes[in_ESI] = in_ECX;
    }
    FAudio_PlatformLockMutex((FAudioMutex)0x127bdd);
    if ((in_RDI->effects).parameterSizes[in_ESI] < in_ECX) {
      pvVar1 = (*in_RDI->audio->pRealloc)((in_RDI->effects).parameters[in_ESI],(size_t)in_ECX);
      (in_RDI->effects).parameters[in_ESI] = pvVar1;
      (in_RDI->effects).parameterSizes[in_ESI] = in_ECX;
    }
    SDL_memcpy((in_RDI->effects).parameters[in_ESI],in_RDX,in_ECX);
    (in_RDI->effects).parameterUpdates[in_ESI] = '\x01';
    FAudio_PlatformUnlockMutex((FAudioMutex)0x127c86);
  }
  else {
    FAudio_OPERATIONSET_QueueSetEffectParameters(in_RDI,in_ESI,in_RDX,in_ECX,in_R8D);
  }
  return 0;
}

Assistant:

uint32_t FAudioVoice_SetEffectParameters(
	FAudioVoice *voice,
	uint32_t EffectIndex,
	const void *pParameters,
	uint32_t ParametersByteSize,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetEffectParameters(
			voice,
			EffectIndex,
			pParameters,
			ParametersByteSize,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	if (voice->effects.parameters[EffectIndex] == NULL)
	{
		voice->effects.parameters[EffectIndex] = voice->audio->pMalloc(
			ParametersByteSize
		);
		voice->effects.parameterSizes[EffectIndex] = ParametersByteSize;
	}
	FAudio_PlatformLockMutex(voice->effectLock);
	LOG_MUTEX_LOCK(voice->audio, voice->effectLock)
	if (voice->effects.parameterSizes[EffectIndex] < ParametersByteSize)
	{
		voice->effects.parameters[EffectIndex] = voice->audio->pRealloc(
			voice->effects.parameters[EffectIndex],
			ParametersByteSize
		);
		voice->effects.parameterSizes[EffectIndex] = ParametersByteSize;
	}
	FAudio_memcpy(
		voice->effects.parameters[EffectIndex],
		pParameters,
		ParametersByteSize
	);
	voice->effects.parameterUpdates[EffectIndex] = 1;
	FAudio_PlatformUnlockMutex(voice->effectLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->effectLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}